

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.c
# Opt level: O0

gf gf_mul(gf in0,gf in1)

{
  uint uVar1;
  uint uVar2;
  uint32_t t;
  uint32_t t1;
  uint32_t t0;
  uint32_t tmp;
  int i;
  gf in1_local;
  gf in0_local;
  
  tmp = (uint)in0 * (in1 & 1);
  for (i = 1; i < 0xc; i = i + 1) {
    tmp = (uint)in0 * ((uint)in1 & 1 << ((byte)i & 0x1f)) ^ tmp;
  }
  uVar1 = (tmp & 0x7fc000) >> 0xc ^ (tmp & 0x7fc000) >> 9 ^ tmp;
  uVar2 = uVar1 & 0x3000;
  return ((ushort)(uVar2 >> 0xc) ^ (ushort)(uVar2 >> 9) ^ (ushort)uVar1) & 0xfff;
}

Assistant:

gf gf_mul(gf in0, gf in1)
{
	int i;

	uint32_t tmp;
	uint32_t t0;
	uint32_t t1;
	uint32_t t;

	t0 = in0;
	t1 = in1;

	tmp = t0 * (t1 & 1);

	for (i = 1; i < GFBITS; i++)
		tmp ^= (t0 * (t1 & (1 << i)));

	t = tmp & 0x7FC000;
	tmp ^= t >> 9;
	tmp ^= t >> 12;

	t = tmp & 0x3000;
	tmp ^= t >> 9;
	tmp ^= t >> 12;

	return tmp & ((1 << GFBITS)-1);
}